

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

IDAckpntMem IDAAckpntInit(IDAMem IDA_mem)

{
  int iVar1;
  long in_RDI;
  IDAckpntMem ck_mem;
  IDAckpntMem in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  undefined1 uVar3;
  IDAMem local_8;
  
  local_8 = (IDAMem)malloc(600);
  if (local_8 == (IDAMem)0x0) {
    local_8 = (IDAMem)0x0;
  }
  else {
    local_8->ida_sunctx = *(SUNContext_conflict *)(in_RDI + 0x4f8);
    local_8->ida_errconS = 0;
    local_8->ida_itolS = 0;
    *(undefined4 *)((long)&local_8->ida_SatolS + 4) = 1;
    *(undefined8 *)&local_8->ida_quadr_sensi = 0;
    uVar3 = false;
    if (*(int *)(in_RDI + 0x60) != 0) {
      uVar3 = *(int *)(in_RDI + 0x78) != 0;
    }
    local_8->ida_atolmin0 = (uint)(byte)uVar3;
    local_8->ida_errconQ = *(int *)(in_RDI + 0x9c);
    if (local_8->ida_errconQ != 0) {
      local_8->ida_itolQ = *(int *)(in_RDI + 0xa0);
    }
    uVar2 = false;
    if (*(int *)(in_RDI + 0x110) != 0) {
      uVar2 = *(int *)(in_RDI + 300) != 0;
    }
    *(uint *)&local_8->ida_user_dataS = (uint)(byte)uVar2;
    *(undefined4 *)local_8->ida_gamma = 3;
    iVar1 = IDAAckpntAllocVectors
                      (local_8,(IDAckpntMem)
                               CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffffe0)));
    if (iVar1 == 0) {
      free(local_8);
      local_8 = (IDAMem)0x0;
    }
    else {
      IDAAckpntCopyVectors
                ((IDAMem)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffffe0)),
                 in_stack_ffffffffffffffd8);
      local_8->ida_gamma[1] = 0.0;
    }
  }
  return (IDAckpntMem)local_8;
}

Assistant:

static IDAckpntMem IDAAckpntInit(IDAMem IDA_mem)
{
  IDAckpntMem ck_mem;

  /* Allocate space for ckdata */
  ck_mem = (IDAckpntMem)malloc(sizeof(struct IDAckpntMemRec));
  if (NULL == ck_mem) { return (NULL); }

  ck_mem->ck_t0  = IDA_mem->ida_tn;
  ck_mem->ck_nst = 0;
  ck_mem->ck_kk  = 1;
  ck_mem->ck_hh  = ZERO;

  /* Test if we need to carry quadratures */
  ck_mem->ck_quadr = IDA_mem->ida_quadr && IDA_mem->ida_errconQ;

  /* Test if we need to carry sensitivities */
  ck_mem->ck_sensi = IDA_mem->ida_sensi;
  if (ck_mem->ck_sensi) { ck_mem->ck_Ns = IDA_mem->ida_Ns; }

  /* Test if we need to carry quadrature sensitivities */
  ck_mem->ck_quadr_sensi = IDA_mem->ida_quadr_sensi && IDA_mem->ida_errconQS;

  /* Alloc 3: current order, i.e. 1,  +   2. */
  ck_mem->ck_phi_alloc = 3;

  if (!IDAAckpntAllocVectors(IDA_mem, ck_mem))
  {
    free(ck_mem);
    ck_mem = NULL;
    return (NULL);
  }
  /* Save phi* vectors from IDA_mem to ck_mem. */
  IDAAckpntCopyVectors(IDA_mem, ck_mem);

  /* Next in list */
  ck_mem->ck_next = NULL;

  return (ck_mem);
}